

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringprintf.cc
# Opt level: O2

void re2::StringAppendV(string *dst,char *format,__va_list_tag *ap)

{
  uint uVar1;
  uint uVar2;
  char *__s;
  ulong __maxlen;
  va_list backup_ap;
  char space [1024];
  undefined8 local_458;
  void *pvStack_450;
  void *local_448;
  char local_438 [1032];
  
  local_448 = ap->reg_save_area;
  local_458._0_4_ = ap->gp_offset;
  local_458._4_4_ = ap->fp_offset;
  pvStack_450 = ap->overflow_arg_area;
  uVar2 = vsnprintf(local_438,0x400,format,&local_458);
  if (uVar2 < 0x400) {
    std::__cxx11::string::append((char *)dst,(ulong)local_438);
  }
  else {
    __maxlen = 0x400;
    while( true ) {
      uVar1 = uVar2 + 1;
      if ((int)uVar2 < 0) {
        uVar1 = (int)__maxlen * 2;
      }
      __maxlen = (ulong)uVar1;
      __s = (char *)operator_new__(__maxlen);
      local_458._0_4_ = ap->gp_offset;
      local_458._4_4_ = ap->fp_offset;
      pvStack_450 = ap->overflow_arg_area;
      local_448 = ap->reg_save_area;
      uVar2 = vsnprintf(__s,__maxlen,format,&local_458);
      if ((int)uVar2 < (int)uVar1 && -1 < (int)uVar2) break;
      operator_delete__(__s);
    }
    std::__cxx11::string::append((char *)dst,(ulong)__s);
    operator_delete__(__s);
  }
  return;
}

Assistant:

static void StringAppendV(string* dst, const char* format, va_list ap) {
  // First try with a small fixed size buffer
  char space[1024];

  // It's possible for methods that use a va_list to invalidate
  // the data in it upon use.  The fix is to make a copy
  // of the structure before using it and use that copy instead.
  va_list backup_ap;
  va_copy(backup_ap, ap);
  int result = vsnprintf(space, sizeof(space), format, backup_ap);
  va_end(backup_ap);

  if ((result >= 0) && (static_cast<unsigned long>(result) < sizeof(space))) {
    // It fit
    dst->append(space, result);
    return;
  }

  // Repeatedly increase buffer size until it fits
  int length = sizeof(space);
  while (true) {
    if (result < 0) {
      // Older behavior: just try doubling the buffer size
      length *= 2;
    } else {
      // We need exactly "result+1" characters
      length = result+1;
    }
    char* buf = new char[length];

    // Restore the va_list before we use it again
    va_copy(backup_ap, ap);
#if !defined(_WIN32)
    result = vsnprintf(buf, length, format, backup_ap);
#else
    // On Windows, the function takes five arguments, not four. With an array,
    // the buffer size will be inferred, but not with a pointer. C'est la vie.
    // (See https://github.com/google/re2/issues/40 for more details.)
    result = vsnprintf(buf, length, _TRUNCATE, format, backup_ap);
#endif
    va_end(backup_ap);

    if ((result >= 0) && (result < length)) {
      // It fit
      dst->append(buf, result);
      delete[] buf;
      return;
    }
    delete[] buf;
  }
}